

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# top_test.cpp
# Opt level: O3

unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
* read_meminfo_abi_cxx11_(void)

{
  int iVar1;
  char cVar2;
  mapped_type *pmVar3;
  long lVar4;
  string *__range2;
  int iVar5;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *in_RDI;
  string line;
  string mem_name;
  ifstream fin;
  undefined1 *local_278;
  long local_270;
  undefined1 local_268 [16];
  key_type local_258;
  long local_238 [4];
  byte abStack_218 [488];
  
  *(_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
    **)in_RDI = in_RDI + 0x30;
  *(undefined8 *)(in_RDI + 8) = 1;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  *(undefined4 *)(in_RDI + 0x20) = 0x3f800000;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  std::ifstream::ifstream(local_238);
  std::ifstream::open((char *)local_238,0x11d13d);
  local_278 = local_268;
  local_270 = 0;
  local_268[0] = 0;
  lVar4 = *(long *)(local_238[0] + -0x18);
  if ((abStack_218[lVar4] & 2) == 0) {
    do {
      cVar2 = std::ios::widen((char)&local_278 + (char)lVar4 + '@');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_278,cVar2);
      std::__cxx11::string::find((char)&local_278,0x3a);
      std::__cxx11::string::substr((ulong)&local_258,(ulong)&local_278);
      if (local_270 == 0) {
        iVar5 = 0;
      }
      else {
        lVar4 = 0;
        iVar5 = 0;
        do {
          iVar1 = (char)local_278[lVar4] + -0x30 + iVar5 * 10;
          if (9 < (int)(char)local_278[lVar4] - 0x30U) {
            iVar1 = iVar5;
          }
          iVar5 = iVar1;
          lVar4 = lVar4 + 1;
        } while (local_270 != lVar4);
      }
      pmVar3 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[](in_RDI,&local_258);
      *pmVar3 = iVar5;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      lVar4 = *(long *)(local_238[0] + -0x18);
    } while ((abStack_218[lVar4] & 2) == 0);
  }
  std::ifstream::close();
  if (local_278 != local_268) {
    operator_delete(local_278);
  }
  std::ifstream::~ifstream(local_238);
  return (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)in_RDI;
}

Assistant:

std::unordered_map<std::string, int>
read_meminfo() {
    std::unordered_map<std::string, int> mem_map;

    std::ifstream fin;
    fin.open("/proc/meminfo");
    std::string line;
    while (!fin.eof()) {
        getline(fin, line);

        std::string mem_name = line.substr(0, line.find(':'));
        int mem_size = 0;
        for (char i : line) {
            if (std::isdigit(i)) {
                mem_size = mem_size * 10 + i - 48;
            }
        }
        mem_map[mem_name] = mem_size;
    }
    fin.close();

    return mem_map;
}